

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickcdef.c
# Opt level: O0

void av1_cdef_dealloc_data(CdefSearchCtx *cdef_search_ctx)

{
  long in_RDI;
  
  if (in_RDI != 0) {
    aom_free(cdef_search_ctx);
    *(undefined8 *)(in_RDI + 0x1f08) = 0;
    aom_free(cdef_search_ctx);
    *(undefined8 *)(in_RDI + 0x1f10) = 0;
    aom_free(cdef_search_ctx);
    *(undefined8 *)(in_RDI + 0x1f18) = 0;
  }
  return;
}

Assistant:

void av1_cdef_dealloc_data(CdefSearchCtx *cdef_search_ctx) {
  if (cdef_search_ctx) {
    aom_free(cdef_search_ctx->mse[0]);
    cdef_search_ctx->mse[0] = NULL;
    aom_free(cdef_search_ctx->mse[1]);
    cdef_search_ctx->mse[1] = NULL;
    aom_free(cdef_search_ctx->sb_index);
    cdef_search_ctx->sb_index = NULL;
  }
}